

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O1

Abc_Ntk_t *
Abc_NtkMiter(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fComb,int nPartSize,int fImplic,int fMulti)

{
  uint uVar1;
  long *plVar2;
  long *plVar3;
  void *pvVar4;
  int iVar5;
  uint uVar6;
  Abc_Ntk_t *pNtkMiter;
  char *pcVar7;
  Vec_Ptr_t *vPairs;
  void **ppvVar8;
  Abc_Obj_t *pAVar9;
  Vec_Ptr_t *pVVar10;
  Abc_Obj_t *pObj;
  int iVar11;
  int iVar12;
  long lVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  ulong uVar19;
  bool bVar20;
  bool bVar21;
  char local_818 [1024];
  char local_418 [1000];
  
  if (pNtk1->nObjCounts[8] != pNtk1->vBoxes->nSize) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x3f,"Abc_Ntk_t *Abc_NtkMiter(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
  }
  if (pNtk2->nObjCounts[8] != pNtk2->vBoxes->nSize) {
    __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                  ,0x40,"Abc_Ntk_t *Abc_NtkMiter(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
  }
  iVar5 = Abc_NtkCompareSignals(pNtk1,pNtk2,fImplic,fComb);
  if (iVar5 == 0) {
    pNtkMiter = (Abc_Ntk_t *)0x0;
  }
  else {
    if ((pNtk1->ntkType == ABC_NTK_STRASH) && (iVar5 = Abc_NtkGetChoiceNum(pNtk1), iVar5 == 0)) {
      bVar20 = false;
    }
    else {
      pNtk1 = Abc_NtkStrash(pNtk1,0,0,0);
      bVar20 = pNtk1 != (Abc_Ntk_t *)0x0;
    }
    if ((pNtk2->ntkType == ABC_NTK_STRASH) && (iVar5 = Abc_NtkGetChoiceNum(pNtk2), iVar5 == 0)) {
      bVar21 = false;
    }
    else {
      pNtk2 = Abc_NtkStrash(pNtk2,0,0,0);
      bVar21 = pNtk2 != (Abc_Ntk_t *)0x0;
    }
    if (pNtk2 == (Abc_Ntk_t *)0x0 || pNtk1 == (Abc_Ntk_t *)0x0) {
      pNtkMiter = (Abc_Ntk_t *)0x0;
    }
    else {
      if (pNtk1->ntkType != ABC_NTK_STRASH) {
        __assert_fail("Abc_NtkIsStrash(pNtk1)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                      ,0x5e,
                      "Abc_Ntk_t *Abc_NtkMiterInt(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
      }
      if (pNtk2->ntkType != ABC_NTK_STRASH) {
        __assert_fail("Abc_NtkIsStrash(pNtk2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                      ,0x5f,
                      "Abc_Ntk_t *Abc_NtkMiterInt(Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)");
      }
      pNtkMiter = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
      sprintf(local_418,"%s_%s_miter",pNtk1->pName,pNtk2->pName);
      pcVar7 = Extra_UtilStrsav(local_418);
      pNtkMiter->pName = pcVar7;
      Abc_NtkMiterPrepare(pNtk1,pNtk2,pNtkMiter,fComb,nPartSize,fMulti);
      Abc_NtkMiterAddOne(pNtk1,pNtkMiter);
      Abc_NtkMiterAddOne(pNtk2,pNtkMiter);
      if (fMulti != 0 && nPartSize != 0) {
        __assert_fail("nPartSize == 0 || fMulti == 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                      ,0x11e,
                      "void Abc_NtkMiterFinalize(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)"
                     );
      }
      vPairs = (Vec_Ptr_t *)malloc(0x10);
      vPairs->nCap = 100;
      vPairs->nSize = 0;
      ppvVar8 = (void **)malloc(800);
      vPairs->pArray = ppvVar8;
      if (fComb == 0) {
        pVVar10 = pNtk1->vPos;
        if (0 < pVVar10->nSize) {
          lVar13 = 0;
          do {
            plVar2 = (long *)pVVar10->pArray[lVar13];
            if (fMulti == 0) {
              uVar17 = *(uint *)((long)plVar2 + 0x14);
              uVar14 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                           (long)*(int *)plVar2[4] * 8) + 0x40);
              uVar6 = vPairs->nCap;
              if (vPairs->nSize == uVar6) {
                if ((int)uVar6 < 0x10) {
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vPairs->pArray,0x80);
                  }
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar6 * 2;
                  if (iVar5 <= (int)uVar6) goto LAB_002df48e;
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((ulong)uVar6 << 4);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vPairs->pArray,(ulong)uVar6 << 4);
                  }
                }
                vPairs->pArray = ppvVar8;
                vPairs->nCap = iVar5;
              }
LAB_002df48e:
              iVar5 = vPairs->nSize;
              uVar6 = iVar5 + 1;
              vPairs->nSize = uVar6;
              vPairs->pArray[iVar5] = (void *)(uVar17 >> 10 & 1 ^ uVar14);
              if (pNtk2->vPos->nSize <= lVar13) goto LAB_002dfa81;
              plVar2 = (long *)pNtk2->vPos->pArray[lVar13];
              uVar17 = *(uint *)((long)plVar2 + 0x14);
              uVar14 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                           (long)*(int *)plVar2[4] * 8) + 0x40);
              uVar1 = vPairs->nCap;
              if (uVar6 == uVar1) {
                if ((int)uVar1 < 0x10) {
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vPairs->pArray,0x80);
                  }
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar1 * 2;
                  if (iVar5 <= (int)uVar1) goto LAB_002df542;
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vPairs->pArray,(ulong)uVar1 << 4);
                  }
                }
                vPairs->pArray = ppvVar8;
                vPairs->nCap = iVar5;
              }
LAB_002df542:
              iVar5 = vPairs->nSize;
              vPairs->nSize = iVar5 + 1;
              vPairs->pArray[iVar5] = (void *)(uVar17 >> 10 & 1 ^ uVar14);
            }
            else {
              if (pNtk2->vCos->nSize <= lVar13) goto LAB_002dfa81;
              plVar3 = (long *)pNtk2->vCos->pArray[lVar13];
              pAVar9 = Abc_AigXor((Abc_Aig_t *)pNtkMiter->pManFunc,
                                  (Abc_Obj_t *)
                                  ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                                  *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                      (long)*(int *)plVar2[4] * 8) + 0x40)),
                                  (Abc_Obj_t *)
                                  ((ulong)(*(uint *)((long)plVar3 + 0x14) >> 10 & 1) ^
                                  *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                      (long)*(int *)plVar3[4] * 8) + 0x40)));
              if (pNtkMiter->vPos->nSize <= lVar13) goto LAB_002dfa81;
              Abc_ObjAddFanin((Abc_Obj_t *)pNtkMiter->vPos->pArray[lVar13],pAVar9);
            }
            lVar13 = lVar13 + 1;
            pVVar10 = pNtk1->vPos;
          } while (lVar13 < pVVar10->nSize);
        }
        pVVar10 = pNtk1->vBoxes;
        if (0 < pVVar10->nSize) {
          lVar13 = 0;
          do {
            plVar2 = (long *)pVVar10->pArray[lVar13];
            if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
              plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                 (long)*(int *)plVar2[4] * 8);
              Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                  (long)*(int *)plVar2[4] * 8) + 0x40)));
            }
            lVar13 = lVar13 + 1;
            pVVar10 = pNtk1->vBoxes;
          } while (lVar13 < pVVar10->nSize);
        }
        pVVar10 = pNtk2->vBoxes;
        if (0 < pVVar10->nSize) {
          lVar13 = 0;
          do {
            plVar2 = (long *)pVVar10->pArray[lVar13];
            if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
              plVar2 = *(long **)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                 (long)*(int *)plVar2[4] * 8);
              Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                              (Abc_Obj_t *)
                              ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                              *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                  (long)*(int *)plVar2[4] * 8) + 0x40)));
            }
            lVar13 = lVar13 + 1;
            pVVar10 = pNtk2->vBoxes;
          } while (lVar13 < pVVar10->nSize);
        }
      }
      else {
        pVVar10 = pNtk1->vCos;
        if (0 < pVVar10->nSize) {
          lVar13 = 0;
          do {
            plVar2 = (long *)pVVar10->pArray[lVar13];
            if (fMulti == 0) {
              uVar17 = *(uint *)((long)plVar2 + 0x14);
              uVar14 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                           (long)*(int *)plVar2[4] * 8) + 0x40);
              uVar6 = vPairs->nCap;
              if (vPairs->nSize == uVar6) {
                if ((int)uVar6 < 0x10) {
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vPairs->pArray,0x80);
                  }
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar6 * 2;
                  if (iVar5 <= (int)uVar6) goto LAB_002df231;
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((ulong)uVar6 << 4);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vPairs->pArray,(ulong)uVar6 << 4);
                  }
                }
                vPairs->pArray = ppvVar8;
                vPairs->nCap = iVar5;
              }
LAB_002df231:
              iVar5 = vPairs->nSize;
              uVar6 = iVar5 + 1;
              vPairs->nSize = uVar6;
              vPairs->pArray[iVar5] = (void *)(uVar17 >> 10 & 1 ^ uVar14);
              if (pNtk2->vCos->nSize <= lVar13) goto LAB_002dfa81;
              plVar2 = (long *)pNtk2->vCos->pArray[lVar13];
              uVar17 = *(uint *)((long)plVar2 + 0x14);
              uVar14 = *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                           (long)*(int *)plVar2[4] * 8) + 0x40);
              uVar1 = vPairs->nCap;
              if (uVar6 == uVar1) {
                if ((int)uVar1 < 0x10) {
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vPairs->pArray,0x80);
                  }
                  iVar5 = 0x10;
                }
                else {
                  iVar5 = uVar1 * 2;
                  if (iVar5 <= (int)uVar1) goto LAB_002df2e5;
                  if (vPairs->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                  }
                  else {
                    ppvVar8 = (void **)realloc(vPairs->pArray,(ulong)uVar1 << 4);
                  }
                }
                vPairs->pArray = ppvVar8;
                vPairs->nCap = iVar5;
              }
LAB_002df2e5:
              iVar5 = vPairs->nSize;
              vPairs->nSize = iVar5 + 1;
              vPairs->pArray[iVar5] = (void *)(uVar17 >> 10 & 1 ^ uVar14);
            }
            else {
              if (pNtk2->vCos->nSize <= lVar13) goto LAB_002dfa81;
              plVar3 = (long *)pNtk2->vCos->pArray[lVar13];
              pAVar9 = Abc_AigXor((Abc_Aig_t *)pNtkMiter->pManFunc,
                                  (Abc_Obj_t *)
                                  ((ulong)(*(uint *)((long)plVar2 + 0x14) >> 10 & 1) ^
                                  *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                                      (long)*(int *)plVar2[4] * 8) + 0x40)),
                                  (Abc_Obj_t *)
                                  ((ulong)(*(uint *)((long)plVar3 + 0x14) >> 10 & 1) ^
                                  *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                                      (long)*(int *)plVar3[4] * 8) + 0x40)));
              if (pNtkMiter->vPos->nSize <= lVar13) goto LAB_002dfa81;
              Abc_ObjAddFanin((Abc_Obj_t *)pNtkMiter->vPos->pArray[lVar13],pAVar9);
            }
            lVar13 = lVar13 + 1;
            pVVar10 = pNtk1->vCos;
          } while (lVar13 < pVVar10->nSize);
        }
      }
      if (nPartSize < 1) {
        if (fMulti == 0) {
          pAVar9 = Abc_AigMiter((Abc_Aig_t *)pNtkMiter->pManFunc,vPairs,fImplic);
          if (pNtkMiter->vPos->nSize < 1) {
LAB_002dfa81:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          Abc_ObjAddFanin((Abc_Obj_t *)*pNtkMiter->vPos->pArray,pAVar9);
        }
      }
      else {
        iVar5 = pNtk1->vCos->nSize;
        if (vPairs->nSize != iVar5 * 2) {
          __assert_fail("Vec_PtrSize(vPairs) == 2 * Abc_NtkCoNum(pNtk1)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcMiter.c"
                        ,0x158,
                        "void Abc_NtkMiterFinalize(Abc_Ntk_t *, Abc_Ntk_t *, Abc_Ntk_t *, int, int, int, int)"
                       );
        }
        pVVar10 = (Vec_Ptr_t *)malloc(0x10);
        uVar14 = 8;
        if (8 < (uint)nPartSize) {
          uVar14 = (ulong)(uint)nPartSize;
        }
        pVVar10->nSize = 0;
        pVVar10->nCap = (int)uVar14;
        ppvVar8 = (void **)malloc(uVar14 << 3);
        pVVar10->pArray = ppvVar8;
        uVar6 = (uint)(0 < iVar5 % nPartSize);
        uVar17 = uVar6 + iVar5 / nPartSize;
        if (uVar17 != 0 && SCARRY4(uVar6,iVar5 / nPartSize) == (int)uVar17 < 0) {
          iVar5 = 1;
          iVar12 = 0;
          lVar13 = 0;
          uVar14 = 0;
          do {
            pVVar10->nSize = 0;
            lVar18 = lVar13;
            uVar19 = (ulong)(uint)nPartSize;
            iVar11 = iVar12;
            iVar15 = iVar5;
            do {
              if (pNtk1->vCos->nSize <= iVar11) break;
              if (vPairs->nSize <= iVar15 + -1) goto LAB_002dfa81;
              pvVar4 = *(void **)((long)vPairs->pArray + lVar18);
              uVar6 = pVVar10->nCap;
              if (pVVar10->nSize == uVar6) {
                if ((int)uVar6 < 0x10) {
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(pVVar10->pArray,0x80);
                  }
                  iVar16 = 0x10;
                }
                else {
                  iVar16 = uVar6 * 2;
                  if (iVar16 <= (int)uVar6) goto LAB_002df7db;
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((ulong)uVar6 << 4);
                  }
                  else {
                    ppvVar8 = (void **)realloc(pVVar10->pArray,(ulong)uVar6 << 4);
                  }
                }
                pVVar10->pArray = ppvVar8;
                pVVar10->nCap = iVar16;
              }
LAB_002df7db:
              iVar16 = pVVar10->nSize;
              uVar6 = iVar16 + 1;
              pVVar10->nSize = uVar6;
              pVVar10->pArray[iVar16] = pvVar4;
              if (vPairs->nSize <= iVar15) goto LAB_002dfa81;
              pvVar4 = *(void **)((long)vPairs->pArray + lVar18 + 8);
              uVar1 = pVVar10->nCap;
              if (uVar6 == uVar1) {
                if ((int)uVar1 < 0x10) {
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc(0x80);
                  }
                  else {
                    ppvVar8 = (void **)realloc(pVVar10->pArray,0x80);
                  }
                  iVar16 = 0x10;
                }
                else {
                  iVar16 = uVar1 * 2;
                  if (iVar16 <= (int)uVar1) goto LAB_002df872;
                  if (pVVar10->pArray == (void **)0x0) {
                    ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
                  }
                  else {
                    ppvVar8 = (void **)realloc(pVVar10->pArray,(ulong)uVar1 << 4);
                  }
                }
                pVVar10->pArray = ppvVar8;
                pVVar10->nCap = iVar16;
              }
LAB_002df872:
              iVar16 = pVVar10->nSize;
              pVVar10->nSize = iVar16 + 1;
              pVVar10->pArray[iVar16] = pvVar4;
              lVar18 = lVar18 + 0x10;
              iVar15 = iVar15 + 2;
              iVar11 = iVar11 + 1;
              uVar19 = uVar19 - 1;
            } while (uVar19 != 0);
            pAVar9 = Abc_AigMiter((Abc_Aig_t *)pNtkMiter->pManFunc,pVVar10,fImplic);
            pObj = Abc_NtkCreateObj(pNtkMiter,ABC_OBJ_PO);
            Abc_ObjAddFanin(pObj,pAVar9);
            if (nPartSize == 1) {
              if ((long)pNtk1->vCos->nSize <= (long)uVar14) goto LAB_002dfa81;
              pcVar7 = Abc_ObjName((Abc_Obj_t *)pNtk1->vCos->pArray[uVar14]);
              strcpy(local_818,pcVar7);
            }
            else {
              sprintf(local_818,"%d",uVar14 & 0xffffffff);
            }
            Abc_ObjAssignName(pObj,"miter_",local_818);
            uVar14 = uVar14 + 1;
            lVar13 = lVar13 + (ulong)(uint)nPartSize * 0x10;
            iVar5 = iVar5 + nPartSize * 2;
            iVar12 = iVar12 + nPartSize;
          } while (uVar14 != uVar17);
        }
        if (pVVar10->pArray != (void **)0x0) {
          free(pVVar10->pArray);
          pVVar10->pArray = (void **)0x0;
        }
        free(pVVar10);
      }
      if (vPairs->pArray != (void **)0x0) {
        free(vPairs->pArray);
        vPairs->pArray = (void **)0x0;
      }
      free(vPairs);
      Abc_AigCleanup((Abc_Aig_t *)pNtkMiter->pManFunc);
      iVar5 = Abc_NtkCheck(pNtkMiter);
      if (iVar5 == 0) {
        puts("Abc_NtkMiter: The network check has failed.");
        Abc_NtkDelete(pNtkMiter);
        pNtkMiter = (Abc_Ntk_t *)0x0;
      }
    }
    if (bVar20) {
      Abc_NtkDelete(pNtk1);
    }
    if (bVar21) {
      Abc_NtkDelete(pNtk2);
    }
  }
  return pNtkMiter;
}

Assistant:

Abc_Ntk_t * Abc_NtkMiter( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fComb, int nPartSize, int fImplic, int fMulti )
{
    Abc_Ntk_t * pTemp = NULL;
    int fRemove1, fRemove2;
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk1) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk2) );
    // check that the networks have the same PIs/POs/latches
    if ( !Abc_NtkCompareSignals( pNtk1, pNtk2, fImplic, fComb ) )
        return NULL;
    // make sure the circuits are strashed 
    fRemove1 = (!Abc_NtkIsStrash(pNtk1) || Abc_NtkGetChoiceNum(pNtk1)) && (pNtk1 = Abc_NtkStrash(pNtk1, 0, 0, 0));
    fRemove2 = (!Abc_NtkIsStrash(pNtk2) || Abc_NtkGetChoiceNum(pNtk2)) && (pNtk2 = Abc_NtkStrash(pNtk2, 0, 0, 0));
    if ( pNtk1 && pNtk2 )
        pTemp = Abc_NtkMiterInt( pNtk1, pNtk2, fComb, nPartSize, fImplic, fMulti );
    if ( fRemove1 )  Abc_NtkDelete( pNtk1 );
    if ( fRemove2 )  Abc_NtkDelete( pNtk2 );
    return pTemp;
}